

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O2

size_t FSE_decompress_usingDTable
                 (void *dst,size_t originalSize,void *cSrc,size_t cSrcSize,FSE_DTable *dt)

{
  uchar uVar1;
  BIT_DStream_status BVar2;
  size_t sVar3;
  uchar *puVar4;
  long lVar5;
  long lVar6;
  uchar *puVar7;
  FSE_DState_t *pFVar8;
  FSE_DState_t state1;
  FSE_DState_t local_68;
  BIT_DStream_t bitD;
  
  puVar4 = (uchar *)((long)dst + (originalSize - 3));
  if (*(short *)((long)dt + 2) == 0) {
    sVar3 = BIT_initDStream(&bitD,cSrc,cSrcSize);
    if (sVar3 < 0xffffffffffffff89) {
      FSE_initDState(&state1,&bitD,dt);
      FSE_initDState(&local_68,&bitD,dt);
      lVar6 = 0;
      while( true ) {
        puVar7 = (uchar *)((long)dst + lVar6);
        BVar2 = BIT_reloadDStream(&bitD);
        if ((puVar4 <= puVar7) || (BVar2 != BIT_DStream_unfinished)) break;
        uVar1 = FSE_decodeSymbol(&state1,&bitD);
        *puVar7 = uVar1;
        uVar1 = FSE_decodeSymbol(&local_68,&bitD);
        puVar7[1] = uVar1;
        uVar1 = FSE_decodeSymbol(&state1,&bitD);
        puVar7[2] = uVar1;
        uVar1 = FSE_decodeSymbol(&local_68,&bitD);
        puVar7[3] = uVar1;
        lVar6 = lVar6 + 4;
      }
      puVar4 = (uchar *)((long)dst + (originalSize - 2));
      pFVar8 = &local_68;
      do {
        lVar5 = lVar6;
        if (puVar4 < (uchar *)((long)dst + lVar5)) {
          return 0xffffffffffffffba;
        }
        uVar1 = FSE_decodeSymbol(&state1,&bitD);
        puVar7 = (uchar *)((long)dst + lVar5) + 1;
        *(uchar *)((long)dst + lVar5) = uVar1;
        BVar2 = BIT_reloadDStream(&bitD);
        if (BVar2 == BIT_DStream_overflow) {
          lVar6 = 2;
          goto LAB_003a2419;
        }
        if (puVar4 < puVar7) {
          return 0xffffffffffffffba;
        }
        uVar1 = FSE_decodeSymbol(pFVar8,&bitD);
        *puVar7 = uVar1;
        BVar2 = BIT_reloadDStream(&bitD);
        lVar6 = lVar5 + 2;
      } while (BVar2 != BIT_DStream_overflow);
      puVar7 = (uchar *)((long)dst + lVar5 + 2);
      lVar6 = 3;
      pFVar8 = &state1;
LAB_003a2419:
      uVar1 = FSE_decodeSymbol(pFVar8,&bitD);
      *puVar7 = uVar1;
      sVar3 = lVar6 + lVar5;
    }
  }
  else {
    sVar3 = BIT_initDStream(&bitD,cSrc,cSrcSize);
    if (sVar3 < 0xffffffffffffff89) {
      FSE_initDState(&state1,&bitD,dt);
      FSE_initDState(&local_68,&bitD,dt);
      lVar6 = 0;
      while( true ) {
        puVar7 = (uchar *)((long)dst + lVar6);
        BVar2 = BIT_reloadDStream(&bitD);
        if ((puVar4 <= puVar7) || (BVar2 != BIT_DStream_unfinished)) break;
        uVar1 = FSE_decodeSymbolFast(&state1,&bitD);
        *puVar7 = uVar1;
        uVar1 = FSE_decodeSymbolFast(&local_68,&bitD);
        puVar7[1] = uVar1;
        uVar1 = FSE_decodeSymbolFast(&state1,&bitD);
        puVar7[2] = uVar1;
        uVar1 = FSE_decodeSymbolFast(&local_68,&bitD);
        puVar7[3] = uVar1;
        lVar6 = lVar6 + 4;
      }
      puVar4 = (uchar *)((long)dst + (originalSize - 2));
      pFVar8 = &local_68;
      do {
        lVar5 = lVar6;
        if (puVar4 < (uchar *)((long)dst + lVar5)) {
          return 0xffffffffffffffba;
        }
        uVar1 = FSE_decodeSymbolFast(&state1,&bitD);
        puVar7 = (uchar *)(lVar5 + (long)dst) + 1;
        *(uchar *)(lVar5 + (long)dst) = uVar1;
        BVar2 = BIT_reloadDStream(&bitD);
        if (BVar2 == BIT_DStream_overflow) {
          lVar6 = 2;
          goto LAB_003a23ff;
        }
        if (puVar4 < puVar7) {
          return 0xffffffffffffffba;
        }
        uVar1 = FSE_decodeSymbolFast(pFVar8,&bitD);
        *puVar7 = uVar1;
        BVar2 = BIT_reloadDStream(&bitD);
        lVar6 = lVar5 + 2;
      } while (BVar2 != BIT_DStream_overflow);
      puVar7 = (uchar *)((long)dst + lVar5 + 2);
      lVar6 = 3;
      pFVar8 = &state1;
LAB_003a23ff:
      uVar1 = FSE_decodeSymbolFast(pFVar8,&bitD);
      *puVar7 = uVar1;
      sVar3 = lVar6 + lVar5;
    }
  }
  return sVar3;
}

Assistant:

size_t FSE_decompress_usingDTable(void* dst, size_t originalSize,
                            const void* cSrc, size_t cSrcSize,
                            const FSE_DTable* dt)
{
    const void* ptr = dt;
    const FSE_DTableHeader* DTableH = (const FSE_DTableHeader*)ptr;
    const U32 fastMode = DTableH->fastMode;

    /* select fast mode (static) */
    if (fastMode) return FSE_decompress_usingDTable_generic(dst, originalSize, cSrc, cSrcSize, dt, 1);
    return FSE_decompress_usingDTable_generic(dst, originalSize, cSrc, cSrcSize, dt, 0);
}